

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfMw.c
# Opt level: O2

sbfMw sbfMw_create(sbfLog log,sbfKeyValue properties)

{
  void *closure;
  u_int uVar1;
  int iVar2;
  char *__nptr;
  sbfMw psVar3;
  sbfKeyValue psVar4;
  sbfMwThread psVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  uVar1 = 1;
  sbfMw_checkSupported(1);
  __nptr = (char *)sbfKeyValue_get(properties,"threads");
  if ((__nptr == (char *)0x0) || (uVar1 = atoi(__nptr), 0xffffffbf < uVar1 - 0x41)) {
    signal(0xd,(__sighandler_t)0x1);
    psVar3 = (sbfMw)sbfMemory_calloc(1,0x20);
    psVar4 = (sbfKeyValue)sbfKeyValue_copy(properties);
    psVar3->mProperties = psVar4;
    psVar3->mLog = log;
    psVar3->mNumThreads = uVar1;
    psVar5 = (sbfMwThread)sbfMemory_calloc(uVar1,0xa0);
    psVar3->mThreads = psVar5;
    sbfLog_log(psVar3->mLog,1,"this is version 0.0.2");
    sbfLog_log(psVar3->mLog,0,"creating middleware %p, using %u threads",psVar3,uVar1);
    iVar2 = evthread_use_pthreads();
    if (iVar2 != 0) {
LAB_00102f8c:
      uVar9 = 0x104173;
      sbfFatal_die();
      if (sbfMw_checkSupported_processed != '\x01') {
        lVar11 = sbfPerfCounter_frequency();
        if (lVar11 != 0) {
          sbfMw_checkSupported::supported = 1;
        }
        sbfMw_checkSupported_processed = '\x01';
      }
      return (sbfMw)(ulong)((uint)sbfMw_checkSupported::supported & uVar9);
    }
    uVar6 = event_config_new();
    event_config_set_flag(uVar6,0x10);
    lVar11 = 0;
    uVar8 = 0;
    do {
      if (psVar3->mNumThreads <= uVar8) goto LAB_00102f66;
      psVar5 = psVar3->mThreads;
      *(sbfMw *)((long)&psVar5->mParent + lVar11) = psVar3;
      *(int *)((long)&psVar5->mIndex + lVar11) = (int)uVar8;
      lVar7 = event_base_new_with_config(uVar6);
      *(long *)((long)&psVar5->mEventBase + lVar11) = lVar7;
      if (lVar7 == 0) {
        sbfFatal_die("event_base_new failed");
        goto LAB_00102f8c;
      }
      closure = (void *)((long)&psVar5->mParent + lVar11);
      lVar10 = (long)&(psVar5->mTimer).ev_evcallback.evcb_active_next.tqe_next + lVar11;
      event_assign(lVar10,lVar7,0xffffffffffffffff,0,sbfMwEventBaseTimerCb,closure);
      sbfMwEventBaseTimerCb((int)lVar10,0,closure);
      iVar2 = pthread_create((pthread_t *)((long)&psVar5->mThread + lVar11),(pthread_attr_t *)0x0,
                             sbfMwEventBaseThreadCb,closure);
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0xa0;
    } while (iVar2 == 0);
    sbfFatal_die("sbfThread_create failed");
LAB_00102f66:
    event_config_free(uVar6);
  }
  else {
    psVar3 = (sbfMw)0x0;
  }
  return psVar3;
}

Assistant:

sbfMw
sbfMw_create (sbfLog log, sbfKeyValue properties)
{
    sbfMw                mw;
    const char*          value;
    int                  threads;
    u_int                i;
    sbfMwThread          thread;
    struct event_config* ec;
#ifdef WIN32
    WSADATA              wsd;
#endif

    // Check all the supported capabilities
    sbfMw_checkSupported (CAP_ALL_MASK);
    
    value = sbfKeyValue_get (properties, "threads");
    if (value == NULL)
        threads = 1;
    else
        threads = atoi (value);
    if (threads <= 0 || threads > SBF_MW_THREAD_LIMIT)
        return NULL;

#ifndef WIN32
    signal (SIGPIPE, SIG_IGN);
#endif

    mw = xcalloc (1, sizeof *mw);
    mw->mProperties = sbfKeyValue_copy (properties);
    mw->mLog = log;
    mw->mNumThreads = threads;
    mw->mThreads = xcalloc (mw->mNumThreads, sizeof *mw->mThreads);

    sbfLog_info (mw->mLog, "this is version " SBF_VERSION);
    sbfLog_debug (mw->mLog,
                  "creating middleware %p, using %u threads",
                  mw,
                  threads);

#ifdef WIN32
    if (WSAStartup (MAKEWORD (2, 2), &wsd) != 0)
        SBF_FATAL ("WSAStartup failed");
    if (evthread_use_windows_threads () != 0)
        SBF_FATAL ("event_use_windows_threads failed");
#else
    if (evthread_use_pthreads () != 0)
        SBF_FATAL ("event_use_pthreads failed");
#endif

    ec = event_config_new ();
    event_config_set_flag (ec, EVENT_BASE_FLAG_EPOLL_USE_CHANGELIST);

    for (i = 0; i < mw->mNumThreads; i++)
    {
        thread = &mw->mThreads[i];
        thread->mParent = mw;
        thread->mIndex = i;

        thread->mEventBase = event_base_new_with_config (ec);
        if (thread->mEventBase == NULL)
            SBF_FATAL ("event_base_new failed");

        event_assign (&thread->mTimer,
                      thread->mEventBase,
                      -1,
                      0,
                      sbfMwEventBaseTimerCb,
                      thread);
        sbfMwEventBaseTimerCb (-1, 0, thread);

        if (sbfThread_create (&thread->mThread,
                              sbfMwEventBaseThreadCb,
                              thread) != 0)
            SBF_FATAL ("sbfThread_create failed");
    }

    event_config_free (ec);
    return mw;
}